

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O1

void __thiscall
HighsSparseMatrix::priceByRowDenseResult
          (HighsSparseMatrix *this,vector<double,_std::allocator<double>_> *result,HVector *column,
          HighsInt from_index,HighsInt debug_report)

{
  double multiplier;
  int iVar1;
  int to_iEl;
  pointer piVar2;
  pointer pdVar3;
  pointer pdVar4;
  long lVar5;
  HighsInt ix;
  int *piVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  
  if (from_index < column->count) {
    lVar7 = (long)from_index;
    do {
      iVar1 = (column->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7];
      multiplier = (column->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar1];
      piVar6 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + (long)iVar1 + 1;
      if (this->format_ == kRowwisePartitioned) {
        piVar6 = (this->p_end_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar1;
      }
      to_iEl = *piVar6;
      if (debug_report == -1 || iVar1 == debug_report) {
        debugReportRowPrice(this,iVar1,multiplier,to_iEl,result);
      }
      iVar1 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar1];
      lVar5 = (long)iVar1;
      if (iVar1 < to_iEl) {
        piVar2 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar3 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar4 = (result->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar1 = piVar2[lVar5];
          dVar9 = pdVar3[lVar5] * multiplier + pdVar4[iVar1];
          uVar8 = -(ulong)(ABS(dVar9) < 1e-14);
          pdVar4[iVar1] = (double)(uVar8 & 0x358dee7a4ad4b81f | ~uVar8 & (ulong)dVar9);
          lVar5 = lVar5 + 1;
        } while (to_iEl != lVar5);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < column->count);
  }
  return;
}

Assistant:

void HighsSparseMatrix::priceByRowDenseResult(
    std::vector<double>& result, const HVector& column,
    const HighsInt from_index, const HighsInt debug_report) const {
  // Assumes that result is zeroed beforehand - in case continuing
  // priceByRow after switch from sparse
  assert(this->isRowwise());
  for (HighsInt ix = from_index; ix < column.count; ix++) {
    HighsInt iRow = column.index[ix];
    double multiplier = column.array[iRow];
    // Determine whether p_end_ or the next start_ should be used to end the
    // loop
    HighsInt to_iEl;
    if (this->format_ == MatrixFormat::kRowwisePartitioned) {
      to_iEl = this->p_end_[iRow];
    } else {
      to_iEl = this->start_[iRow + 1];
    }
    if (debug_report == kDebugReportAll || debug_report == iRow)
      debugReportRowPrice(iRow, multiplier, to_iEl, result);
    for (HighsInt iEl = this->start_[iRow]; iEl < to_iEl; iEl++) {
      HighsInt iCol = this->index_[iEl];
      double value0 = result[iCol];
      double value1 = value0 + multiplier * this->value_[iEl];
      result[iCol] = (fabs(value1) < kHighsTiny) ? kHighsZero : value1;
    }
  }
}